

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

bool __thiscall Inline::GetInlineeHasArgumentObject(Inline *this,Func *inlinee)

{
  OpCode OVar1;
  Inline *pIVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  OpndKind OVar6;
  BuiltinFunction BVar7;
  LocalFunctionId localFuncId;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar8;
  undefined **ppuVar9;
  char *this_01;
  Instr *pIVar10;
  SymID argumentsSymId;
  Instr *instr;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(inlinee->m_workItem);
  bVar4 = JITTimeFunctionBody::UsesArgumentsObject(this_00);
  if (bVar4) {
    if ((inlinee->field_0x241 & 0x10) == 0) {
LAB_0055e243:
      bVar4 = true;
    }
    else {
      instr = inlinee->m_headInstr;
      bVar4 = instr != (Instr *)0x0;
      if (bVar4) {
        ppuVar9 = &PTR_0155fe48;
        puVar8 = (undefined4 *)__tls_get_addr();
        argumentsSymId = 0;
        pIVar10 = (Instr *)0x0;
        do {
          this_01 = (char *)ppuVar9;
          if ((pIVar10 != (Instr *)0x0) && (pIVar10->m_next != instr)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            this_01 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
            ;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x16a9,
                               "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                               "Modifying instr list but not using EDITING iterator!");
            if (!bVar4) goto LAB_0055e594;
            *puVar8 = 0;
          }
          if (instr->m_func == inlinee) {
            OVar1 = instr->m_opcode;
            if ((ushort)(OVar1 - LdHeapArguments) < 2) {
              pIVar2 = (Inline *)instr->m_dst;
              this_01 = (char *)pIVar2;
              OVar5 = IR::Opnd::GetKind((Opnd *)pIVar2);
              if (OVar5 != OpndKindReg) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar8 = 1;
                this_01 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                ;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                if (!bVar4) goto LAB_0055e594;
                *puVar8 = 0;
              }
              argumentsSymId = *(SymID *)(*(long *)&pIVar2->currentForInDepth + 0x10);
            }
            else if (argumentsSymId == 0) {
              argumentsSymId = 0;
            }
            else if (OVar1 < BytecodeArgOutCapture) {
              if (OVar1 != ArgOut_A_InlineBuiltIn) {
                if (OVar1 == ArgOut_A_FromStackArgs) {
                  if (this->isInInlinedApplyCall == true) goto LAB_0055e4fb;
                }
                else if (OVar1 != BailOnNotStackArgs) {
LAB_0055e4fb:
                  bVar4 = HasArgumentsAccess((Inline *)this_01,instr,argumentsSymId);
                  if (bVar4) goto LAB_0055e243;
                }
              }
            }
            else if (1 < OVar1 - 0x242) {
              if (OVar1 == InlineBuiltInEnd) {
                if (this->isInInlinedApplyCall == true) {
                  this->isInInlinedApplyCall = false;
                }
              }
              else {
                if (OVar1 != InlineBuiltInStart) goto LAB_0055e4fb;
                pIVar2 = (Inline *)instr->m_src1;
                OVar5 = IR::Opnd::GetKind((Opnd *)pIVar2);
                this_01 = (char *)pIVar2;
                OVar6 = IR::Opnd::GetKind((Opnd *)pIVar2);
                if (OVar5 == OpndKindAddr) {
                  if (OVar6 != OpndKindAddr) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar8 = 1;
                    bVar4 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                       ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
                    if (!bVar4) goto LAB_0055e594;
                    *puVar8 = 0;
                  }
                  if (((ulong)pIVar2->lastStatementBoundary & 2) == 0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar8 = 1;
                    bVar4 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                       ,0x16c0,"(builtInOpnd->AsAddrOpnd()->m_isFunction)",
                                       "builtInOpnd->AsAddrOpnd()->m_isFunction");
                    if (!bVar4) goto LAB_0055e594;
                    *puVar8 = 0;
                  }
                  OVar5 = IR::Opnd::GetKind((Opnd *)pIVar2);
                  if (OVar5 != OpndKindAddr) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar8 = 1;
                    bVar4 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                       ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
                    if (!bVar4) {
LAB_0055e594:
                      pcVar3 = (code *)invalidInstructionException();
                      (*pcVar3)();
                    }
                    *puVar8 = 0;
                  }
                  localFuncId = FixedFieldInfo::GetLocalFuncId
                                          (*(FixedFieldInfo **)&pIVar2->currentForInDepth);
                  this_01 = (char *)(ulong)localFuncId;
                  BVar7 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(localFuncId);
                }
                else {
                  if (OVar6 != OpndKindReg) goto LAB_0055e574;
                  this_01 = (char *)pIVar2;
                  OVar5 = IR::Opnd::GetKind((Opnd *)pIVar2);
                  if (OVar5 != OpndKindReg) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar8 = 1;
                    this_01 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                    ;
                    bVar4 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                    if (!bVar4) goto LAB_0055e594;
                    *puVar8 = 0;
                  }
                  BVar7._value = *(byte *)(*(long *)&pIVar2->currentForInDepth + 0x1d);
                }
                if (BVar7._value == '<') {
                  this->isInInlinedApplyCall = true;
                }
              }
            }
          }
LAB_0055e574:
          bVar4 = instr->m_next != (Instr *)0x0;
          ppuVar9 = (undefined **)this_01;
          pIVar10 = instr;
          instr = instr->m_next;
        } while (bVar4);
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool
Inline::GetInlineeHasArgumentObject(Func * inlinee)
{
    if (!inlinee->GetJITFunctionBody()->UsesArgumentsObject())
    {
        // If inlinee has no arguments access return false
        return false;
    }

    // Inlinee has arguments access

    if (!inlinee->GetApplyTargetInliningRemovedArgumentsAccess())
    {
        return true;
    }

    // Its possible there is no more arguments access after we inline apply target; validate the same.
    // This sounds expensive, but we are only walking inlinee which has apply target inlining optimization enabled.
    // Also we walk only instruction in that inlinee and not nested inlinees. So it is not expensive.
    SymID argumentsSymId = 0;
    FOREACH_INSTR_IN_FUNC(instr, inlinee)
    {
        if (instr->m_func != inlinee)
        {
            // Skip nested inlinees
            continue;
        }

        if (instr->m_opcode == Js::OpCode::LdHeapArguments || instr->m_opcode == Js::OpCode::LdLetHeapArguments)
        {
            argumentsSymId = instr->GetDst()->AsRegOpnd()->m_sym->m_id;
        }
        else if (argumentsSymId != 0)
        {
            // Once we find the arguments object i.e. argumentsSymId is set
            // Make sure no one refers to it.
            switch (instr->m_opcode)
            {
                case Js::OpCode::InlineBuiltInStart:
                    {
                        IR::Opnd* builtInOpnd = instr->GetSrc1();
                        if (builtInOpnd->IsAddrOpnd())
                        {
                            Assert(builtInOpnd->AsAddrOpnd()->m_isFunction);

                            Js::BuiltinFunction builtinFunction = Js::JavascriptLibrary::GetBuiltInForFuncInfo(((FixedFieldInfo*)builtInOpnd->AsAddrOpnd()->m_metadata)->GetLocalFuncId());
                            if (builtinFunction == Js::BuiltinFunction::JavascriptFunction_Apply)
                            {
                                this->SetIsInInlinedApplyCall(true);
                            }
                        }
                        else if (builtInOpnd->IsRegOpnd())
                        {
                            if (builtInOpnd->AsRegOpnd()->m_sym->m_builtInIndex == Js::BuiltinFunction::JavascriptFunction_Apply)
                            {
                                this->SetIsInInlinedApplyCall(true);
                            }
                        }
                        break;
                    }

                case Js::OpCode::InlineBuiltInEnd:
                    {
                        if(this->GetIsInInlinedApplyCall())
                        {
                            this->SetIsInInlinedApplyCall(false);
                        }
                        break;
                    }

                case Js::OpCode::BailOnNotStackArgs:
                case Js::OpCode::ArgOut_A_InlineBuiltIn:
                case Js::OpCode::BytecodeArgOutCapture:
                case Js::OpCode::BytecodeArgOutUse:
                    // These are part of arguments optimization and we are fine if they access stack args.
                    break;

                case Js::OpCode::ArgOut_A_FromStackArgs:
                    {
                        // If ArgOut_A_FromStackArgs is part of the call sequence for apply built-in inlining (as opposed to apply target inlining),
                        // then arguments access continues to exist.
                        if (this->GetIsInInlinedApplyCall() && HasArgumentsAccess(instr, argumentsSymId))
                        {
                            return true;
                        }
                        break;
                    }

                default:
                    {
                        if (HasArgumentsAccess(instr, argumentsSymId))
                        {
                            return true;
                        }
                    }
            }
        }
    }
    NEXT_INSTR_IN_FUNC;
    return false;
}